

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

Vector * __thiscall flexbuffers::Reference::AsVector(Vector *__return_storage_ptr__,Reference *this)

{
  uint8_t *data;
  
  if (this->type_ - FBT_MAP < 2) {
    data = Indirect(this);
    Sized::Sized(&__return_storage_ptr__->super_Sized,data,this->byte_width_);
  }
  else {
    Vector::EmptyVector();
  }
  return __return_storage_ptr__;
}

Assistant:

Vector AsVector() const {
    if (type_ == FBT_VECTOR || type_ == FBT_MAP) {
      return Vector(Indirect(), byte_width_);
    } else {
      return Vector::EmptyVector();
    }
  }